

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InlinedStringField::SetAllocatedNoArena
          (InlinedStringField *this,string *param_1,string *value)

{
  string *psVar1;
  string *value_local;
  string *param_1_local;
  InlinedStringField *this_local;
  
  if (value == (string *)0x0) {
    get_mutable_abi_cxx11_(this);
    std::__cxx11::string::clear();
  }
  else {
    psVar1 = get_mutable_abi_cxx11_(this);
    std::__cxx11::string::assign((string *)psVar1);
    if (value != (string *)0x0) {
      std::__cxx11::string::~string((string *)value);
      operator_delete(value,0x20);
    }
  }
  return;
}

Assistant:

inline void InlinedStringField::SetAllocatedNoArena(
    const std::string* /*default_value*/, std::string* value) {
  if (value == nullptr) {
    // Currently, inlined string field can't have non empty default.
    get_mutable()->clear();
  } else {
    get_mutable()->assign(std::move(*value));
    delete value;
  }
}